

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

void __thiscall doublechecked::Roaring::Roaring(Roaring *this,Roaring *other_plain)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint32_t uVar3;
  RoaringSetBitBiDirectionalIterator *pRVar4;
  Roaring *__range2;
  value_type value;
  RoaringSetBitBiDirectionalIterator __begin2;
  uint32_t local_5c;
  roaring_uint32_iterator_t local_58;
  
  roaring::Roaring::Roaring(&this->plain);
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roaring::Roaring::operator=(&this->plain,other_plain);
  roaring::Roaring::begin((RoaringSetBitBiDirectionalIterator *)&local_58,&this->plain);
  pRVar4 = roaring::Roaring::end(&this->plain);
  uVar3 = (pRVar4->i).current_value;
  bVar2 = (pRVar4->i).has_value;
  while ((local_58.current_value != uVar3 || (local_58.has_value != bVar2))) {
    local_5c = local_58.current_value;
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->check,&local_5c);
    roaring_uint32_iterator_advance(&local_58);
  }
  return;
}

Assistant:

Roaring(roaring::Roaring &&other_plain) {
        plain = std::move(other_plain);
        for (auto value : plain) check.insert(value);
    }